

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::SimpleRecurrentLayerParams::SharedCtor(SimpleRecurrentLayerParams *this)

{
  *(undefined4 *)((long)&this->outputvectorsize_ + 7) = 0;
  this->inputvectorsize_ = 0;
  this->outputvectorsize_ = 0;
  this->recursionmatrix_ = (WeightParams *)0x0;
  this->biasvector_ = (WeightParams *)0x0;
  this->activation_ = (ActivationParams *)0x0;
  this->weightmatrix_ = (WeightParams *)0x0;
  this->_cached_size_ = 0;
  return;
}

Assistant:

void SimpleRecurrentLayerParams::SharedCtor() {
  ::memset(&activation_, 0, reinterpret_cast<char*>(&reverseinput_) -
    reinterpret_cast<char*>(&activation_) + sizeof(reverseinput_));
  _cached_size_ = 0;
}